

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O0

vector_bagwell<unsigned_char_*,_16U> * __thiscall
TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_>::get_bucket
          (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this,uint index)

{
  size_type sVar1;
  reference ppvVar2;
  vector_bagwell<unsigned_char_*,_16U> *b_1;
  undefined8 local_28;
  vector_bagwell<unsigned_char_*,_16U> *b;
  uint index_local;
  TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *this_local;
  
  sVar1 = std::vector<void_*,_std::allocator<void_*>_>::size(&this->_buckets);
  if (index < sVar1) {
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&this->_buckets,(ulong)index)
    ;
    local_28 = (vector_bagwell<unsigned_char_*,_16U> *)*ppvVar2;
    if (local_28 == (vector_bagwell<unsigned_char_*,_16U> *)0x0) {
      local_28 = (vector_bagwell<unsigned_char_*,_16U> *)operator_new(0x28);
      vector_bagwell<unsigned_char_*,_16U>::vector_bagwell(local_28);
      ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->_buckets,(ulong)index);
      *ppvVar2 = local_28;
    }
    this_local = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)local_28;
  }
  else {
    std::vector<void_*,_std::allocator<void_*>_>::resize(&this->_buckets,(ulong)(index + 1));
    this_local = (TrieNode<unsigned_short,_vector_bagwell<unsigned_char_*,_16U>_> *)
                 operator_new(0x28);
    vector_bagwell<unsigned_char_*,_16U>::vector_bagwell
              ((vector_bagwell<unsigned_char_*,_16U> *)this_local);
    ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::operator[](&this->_buckets,(ulong)index)
    ;
    *ppvVar2 = this_local;
  }
  return (vector_bagwell<unsigned_char_*,_16U> *)this_local;
}

Assistant:

BucketT* get_bucket(unsigned index)
	{
		if (index < _buckets.size()) {
			BucketT* b = static_cast<BucketT*>(_buckets[index]);
			if (not b) { _buckets[index] = b = new BucketT; }
			return b;
		} else {
			_buckets.resize(index+1);
			BucketT* b = new BucketT;
			_buckets[index] = b;
			return b;
		}
	}